

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall kratos::Generator::transfer_content(Generator *this,Generator *gen,string *prefix)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar2;
  Var *pVVar3;
  _Base_ptr p_Var4;
  char *in_RCX;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  pointer psVar7;
  _Hash_node_base *p_Var8;
  string local_b0;
  _Rb_tree_node_base *local_90;
  _Base_ptr local_88;
  string *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *parameters;
  string target_name;
  
  local_80 = prefix;
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  reserve(&gen->stmts_,
          ((long)(this->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) +
          ((long)(gen->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(gen->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  psVar7 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    do {
      target_name.field_2._8_8_ =
           (psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        in_RCX = &__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      (*(((element_type *)target_name.field_2._8_8_)->super_IRNode)._vptr_IRNode[7])
                (target_name.field_2._8_8_,gen);
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)&gen->stmts_,(shared_ptr<kratos::Stmt> *)((long)&target_name.field_2 + 8));
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  p_Var8 = (this->exprs_)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      Var::set_parent_generator((Var *)p_Var8[1]._M_nxt,gen);
      std::
      _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
                ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&gen->exprs_,p_Var8 + 1);
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  p_Var4 = (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90 = &(this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != local_90) {
    local_88 = &(gen->vars_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = &gen->params_;
    do {
      p_Var5 = p_Var4 + 1;
      *(Generator **)(*(long *)(p_Var4 + 2) + 0x200) = gen;
      parameters = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                    *)&target_name._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&parameters,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              ::find(&(gen->vars_)._M_t,(key_type *)p_Var5);
      if (iVar2._M_node != local_88) {
        get_unique_variable_name(&local_b0,this,local_80,(string *)p_Var5);
        std::__cxx11::string::operator=((string *)&parameters,(string *)&local_b0);
        in_RCX = (char *)p_Var5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          in_RCX = (char *)p_Var5;
        }
      }
      p_Var5 = p_Var4 + 2;
      std::__cxx11::string::_M_assign((string *)(*(long *)p_Var5 + 0x78));
      if ((*(Var **)p_Var5)->type_ == PortIO) {
        pVVar3 = var(gen,*(Var **)p_Var5,(string *)&parameters);
        (**(code **)(**(long **)p_Var5 + 0xa0))(*(long **)p_Var5,pVVar3);
        Var::move_sink_to(*(Var **)p_Var5,pVVar3,gen,false);
        in_RCX = (char *)0x0;
        Var::move_src_to(*(Var **)p_Var5,pVVar3,gen,false);
      }
      else {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::Var>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_bool>
                    *)&gen->vars_,
                   (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                    *)&parameters,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var5,
                   (shared_ptr<kratos::Var> *)in_RCX);
      }
      pVVar3 = *(Var **)p_Var5;
      if (this->parent_generator_ == gen) {
        set_var_params(pVVar3,local_78);
      }
      else {
        (*(pVVar3->super_IRNode)._vptr_IRNode[0x23])(pVVar3,0);
        pVVar3 = *(Var **)p_Var5;
        if ((pVVar3->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pVVar3->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar6 = 0;
          do {
            Var::set_size_param(pVVar3,(uint32_t)uVar6,(Var *)0x0);
            uVar6 = uVar6 + 1;
            pVVar3 = *(Var **)p_Var5;
          } while (uVar6 < (ulong)((long)(pVVar3->size_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pVVar3->size_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
      }
      if (parameters !=
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
           *)&target_name._M_string_length) {
        operator_delete(parameters,target_name._M_string_length + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_90);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::clear
            (&this->stmts_);
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,_std::shared_ptr<kratos::Expr>,_std::allocator<std::shared_ptr<kratos::Expr>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Expr>_>,_std::hash<std::shared_ptr<kratos::Expr>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->exprs_)._M_h);
  return;
}

Assistant:

void Generator::transfer_content(kratos::Generator &gen, const std::string &prefix) {
    // move all stuff to the generator
    // except the variable
    gen.stmts_.reserve(gen.stmts_.size() + stmts_.size());
    for (auto const &stmt : stmts_) {
        gen.add_stmt(stmt);
    }
    for (auto const &expr : exprs_) {
        expr->set_parent_generator(&gen);
        gen.exprs_.emplace(expr);
    }

    for (auto const &[var_name, var] : vars_) {
        var->set_generator(&gen);
        std::string target_name = var_name;
        if (gen.has_var(var_name)) {
            target_name = get_unique_variable_name(prefix, var_name);
        }
        var->name = target_name;
        // maybe it's a port, in that case we need to copy its definition and create a var
        if (var->type() == VarType::PortIO) {
            auto &new_var = gen.var(*var, target_name);
            var->move_linked_to(&new_var);
            Var::move_sink_to(var.get(), &new_var, &gen, false);
            Var::move_src_to(var.get(), &new_var, &gen, false);
        } else {
            gen.vars_.emplace(target_name, var);
        }
        if (parent_generator_ == &gen) {
            const auto &parameters = gen.params_;
            set_var_params(var.get(), parameters);
        } else {
            // unlink parameters
            var->set_width_param(nullptr);
            for (uint64_t i = 0; i < var->size().size(); i++) {
                var->set_size_param(i, nullptr);
            }
        }
    }

    stmts_.clear();
    exprs_.clear();
}